

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O0

gc_heap_ptr<mjs::global_object> __thiscall
mjs::global_object::make(global_object *this,gc_heap *h,version ver,bool *strict_mode)

{
  global_object_impl *this_00;
  undefined8 extraout_RDX;
  gc_heap_ptr<mjs::global_object> gVar1;
  undefined1 local_38 [8];
  gc_heap_ptr<mjs::global_object_impl> global;
  bool *strict_mode_local;
  gc_heap *pgStack_18;
  version ver_local;
  gc_heap *h_local;
  
  global.super_gc_heap_ptr_untyped._8_8_ = strict_mode;
  strict_mode_local._4_4_ = ver;
  pgStack_18 = h;
  h_local = (gc_heap *)this;
  gc_heap::make<mjs::global_object_impl,mjs::gc_heap&,mjs::version&,bool&>
            ((gc_heap *)local_38,h,(version *)h,(bool *)((long)&strict_mode_local + 4));
  this_00 = gc_heap_ptr<mjs::global_object_impl>::operator->
                      ((gc_heap_ptr<mjs::global_object_impl> *)local_38);
  global_object_impl::popuplate_global(this_00);
  gc_heap_ptr<mjs::global_object>::gc_heap_ptr<mjs::global_object_impl,void>
            ((gc_heap_ptr<mjs::global_object> *)this,
             (gc_heap_ptr<mjs::global_object_impl> *)local_38);
  gc_heap_ptr<mjs::global_object_impl>::~gc_heap_ptr
            ((gc_heap_ptr<mjs::global_object_impl> *)local_38);
  gVar1.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  gVar1.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (gc_heap_ptr<mjs::global_object>)gVar1.super_gc_heap_ptr_untyped;
}

Assistant:

gc_heap_ptr<global_object> global_object::make(gc_heap& h, version ver, bool& strict_mode) {
    auto global = h.make<global_object_impl>(h, ver, strict_mode);
    global->popuplate_global(); // Populate here so the self_ptr() won't fail the assert
    return global;
}